

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupOrderDfsChoices_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pObj_00;
  
  if (pObj->Value == 0xffffffff) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                    ,0x14e,
                    "void Gia_ManDupOrderDfsChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = Gia_ObjId(p,pObj);
    if ((p->pNexts[iVar2] != 0) &&
       (pObj_00 = Gia_ManObj(p,p->pNexts[iVar2]), pObj_00 != (Gia_Obj_t *)0x0)) {
      Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj_00);
      Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff));
      Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      iVar2 = Gia_ObjFanin0Copy(pObj);
      iVar3 = Gia_ObjFanin1Copy(pObj);
      uVar4 = Gia_ManAppendAnd(pNew,iVar2,iVar3);
      pObj->Value = uVar4;
      iVar2 = Abc_Lit2Var(pObj_00->Value);
      iVar2 = Abc_Lit2Var(iVar2);
      piVar1 = pNew->pNexts;
      uVar4 = Abc_Lit2Var(pObj->Value);
      piVar1[uVar4] = iVar2;
      uVar4 = Abc_Lit2Var(pObj->Value);
      uVar5 = Abc_Lit2Var(pObj_00->Value);
      if (uVar5 < uVar4) {
        return;
      }
      __assert_fail("Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pNext->Value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                    ,0x158,
                    "void Gia_ManDupOrderDfsChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff));
    Gia_ManDupOrderDfsChoices_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar2 = Gia_ObjFanin0Copy(pObj);
    iVar3 = Gia_ObjFanin1Copy(pObj);
    uVar4 = Gia_ManAppendAnd(pNew,iVar2,iVar3);
    pObj->Value = uVar4;
  }
  return;
}

Assistant:

void Gia_ManDupOrderDfsChoices_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pNext;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pNext = Gia_ObjNextObj( p, Gia_ObjId(p, pObj) );
    if ( pNext )
        Gia_ManDupOrderDfsChoices_rec( pNew, p, pNext );
    Gia_ManDupOrderDfsChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManDupOrderDfsChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( pNext )
    {
        pNew->pNexts[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var( Abc_Lit2Var(pNext->Value) );
        assert( Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pNext->Value) );
    }
}